

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
* OpenMD::operator||(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                     *__return_storage_ptr__,
                    ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                    *cons1,ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *cons2)

{
  pointer pcVar1;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_c0;
  
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
  OrParamConstraint(&local_c0,
                    (OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                     *)cons1);
  pcVar1 = (cons2->description_)._M_dataplus._M_p;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,pcVar1,pcVar1 + (cons2->description_)._M_string_length);
  pcVar1 = cons2[1].description_._M_dataplus._M_p;
  local_e0._M_p = (pointer)&local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + cons2[1].description_._M_string_length);
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  ::OrParamConstraint(__return_storage_ptr__,&local_c0,(EqualIgnoreCaseConstraint *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.cons2_.rhs_._M_dataplus._M_p != &local_c0.cons2_.rhs_.field_2) {
    operator_delete(local_c0.cons2_.rhs_._M_dataplus._M_p,
                    local_c0.cons2_.rhs_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
         ._M_dataplus._M_p !=
      &local_c0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
       field_2) {
    operator_delete(local_c0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                    description_._M_dataplus._M_p,
                    local_c0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                    description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.cons1_.rhs_._M_dataplus._M_p != &local_c0.cons1_.rhs_.field_2) {
    operator_delete(local_c0.cons1_.rhs_._M_dataplus._M_p,
                    local_c0.cons1_.rhs_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
         ._M_dataplus._M_p !=
      &local_c0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
       field_2) {
    operator_delete(local_c0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                    description_._M_dataplus._M_p,
                    local_c0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                    description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_._M_dataplus._M_p !=
      &local_c0.
       super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
       .description_.field_2) {
    operator_delete(local_c0.
                    super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                    .description_._M_dataplus._M_p,
                    local_c0.
                    super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                    .description_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline OrParamConstraint<Cons1T, Cons2T> operator||(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return OrParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }